

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deRandom.hpp
# Opt level: O2

Primitive __thiscall
de::Random::
chooseWeighted<deqp::gls::DrawTestSpec::Primitive,deqp::gls::DrawTestSpec::Primitive*,float_const*>
          (Random *this,Primitive *first,Primitive *last,float *weight)

{
  Primitive *pPVar1;
  int iVar2;
  Primitive *pPVar3;
  Primitive *pPVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  fVar5 = 0.0;
  for (iVar2 = 0; first + iVar2 != last; iVar2 = iVar2 + 1) {
    fVar5 = fVar5 + weight[iVar2];
  }
  fVar6 = deRandom_getFloat(&this->m_rnd);
  iVar2 = 0;
  fVar7 = 0.0;
  pPVar3 = last;
  while( true ) {
    pPVar1 = first + iVar2;
    pPVar4 = pPVar3;
    if (pPVar1 == last) break;
    fVar7 = fVar7 + weight[iVar2];
    pPVar4 = pPVar1;
    if (fVar5 * fVar6 + 0.0 < fVar7) break;
    if (0.0 < weight[iVar2]) {
      pPVar3 = pPVar1;
    }
    iVar2 = iVar2 + 1;
  }
  return *pPVar4;
}

Assistant:

T Random::chooseWeighted (InputIter first, InputIter last, WeightIter weight)
{
	// Compute weight sum
	float	weightSum	= 0.0f;
	int		ndx;
	for (ndx = 0; (first + ndx) != last; ndx++)
		weightSum += *(weight + ndx);

	// Random point in 0..weightSum
	float p = getFloat(0.0f, weightSum);

	// Find item in range
	InputIter	lastNonZero	= last;
	float		curWeight	= 0.0f;
	for (ndx = 0; (first + ndx) != last; ndx++)
	{
		float w = *(weight + ndx);

		curWeight += w;

		if (p < curWeight)
			return *(first + ndx);
		else if (w > 0.0f)
			lastNonZero = first + ndx;
	}

	DE_ASSERT(lastNonZero != last);
	return *lastNonZero;
}